

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::renderTriangleTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkPipelineDepthStencilStateCreateFlags *pVVar1;
  VkFenceCreateFlags *pVVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  float *pfVar4;
  TestLog *log;
  VkPipelineLayout obj;
  undefined8 obj_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TestStatus *pTVar8;
  undefined8 obj_01;
  undefined8 obj_02;
  undefined8 obj_03;
  undefined8 uVar9;
  bool bVar10;
  VkResult VVar11;
  VkDevice device;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  const_iterator cVar12;
  deUint32 queueFamilyIndex;
  VkImageMemoryBarrier colorAttBarrier;
  long local_c38;
  long *plStack_c30;
  VkAccessFlags local_c28;
  VkAccessFlags VStack_c24;
  VkImageLayout VStack_c20;
  VkImageLayout VStack_c1c;
  VkFenceCreateInfo fenceParams;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_bd0;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b40;
  VkMemoryBarrier vertFlushBarrier;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_af0;
  VkBuffer local_ad8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_ad0;
  TestStatus *local_ab0;
  VkQueue local_aa8;
  TextureFormat tcuFormat;
  IVec3 posDeviation;
  VkSampleMask sampleMask;
  TextureLevel refImage;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_a50;
  VkFramebuffer local_a38;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_a30;
  VkPipeline local_a18;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_a10;
  VkShaderModule local_9f8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_9f0;
  VkShaderModule local_9d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_9d0;
  VkStructureType local_9b8;
  undefined4 uStack_9b4;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_9b0;
  VkImageView local_998;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_990;
  Vec4 clearColor;
  Vec4 vertices [3];
  UVec4 threshold;
  VkAttachmentReference colorAttRef;
  VkVertexInputBindingDescription vertexBinding0;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D scissor0;
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkViewport viewport0;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkPipelineColorBlendAttachmentState attBlendParams;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkAttachmentDescription colorAttDesc;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineViewportStateCreateInfo viewportParams;
  VkPipelineColorBlendStateCreateInfo local_510;
  VkBufferCreateInfo readImageBufferParams;
  VkBufferCreateInfo vertexBufferParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkFramebufferCreateInfo framebufferParams;
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription local_3a8;
  VkImageViewCreateInfo colorAttViewParams;
  VkImageCreateInfo imageParams;
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  SimpleAllocator memAlloc;
  
  local_ab0 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_aa8 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pipelineParams,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&pipelineParams);
  clearColor.m_data[0] = 0.125;
  clearColor.m_data[1] = 0.25;
  clearColor.m_data[2] = 0.75;
  clearColor.m_data[3] = 1.0;
  vertices[0].m_data[0] = -0.5;
  vertices[0].m_data[1] = -0.5;
  vertices[0].m_data[2] = 0.0;
  vertices[0].m_data[3] = 1.0;
  vertices[1].m_data[0] = 0.5;
  vertices[1].m_data[1] = -0.5;
  vertices[1].m_data[2] = 0.0;
  vertices[1].m_data[3] = 1.0;
  vertices[2].m_data[0] = 0.0;
  vertices[2].m_data[1] = 0.5;
  vertices[2].m_data[2] = 0.0;
  vertices[2].m_data[3] = 1.0;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.pNext = (void *)0x0;
  vertexBufferParams.flags = 0;
  vertexBufferParams.size = 0x30;
  vertexBufferParams.usage = 0x80;
  vertexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vertexBufferParams.queueFamilyIndexCount = 1;
  vertexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &vertexBufferParams,(VkAllocationCallbacks *)0x0);
  DStack_ad0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_ad0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_ad8.m_internal = pipelineParams._0_8_;
  DStack_ad0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkBuffer)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  uVar5 = depthStencilParams._0_8_;
  VVar11 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,local_ad8.m_internal,*(undefined8 *)(depthStencilParams._0_8_ + 8));
  ::vk::checkResult(VVar11,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x16a);
  readImageBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  readImageBufferParams.pNext = (void *)0x0;
  readImageBufferParams.flags = 0;
  readImageBufferParams.size = 0x40000;
  readImageBufferParams.usage = 2;
  readImageBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  readImageBufferParams.queueFamilyIndexCount = 1;
  readImageBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &readImageBufferParams,(VkAllocationCallbacks *)0x0);
  obj_01 = pipelineParams._0_8_;
  DStack_b40.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_b40.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  DStack_b40.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkBuffer)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  uVar6 = depthStencilParams._0_8_;
  VVar11 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,obj_01,*(undefined8 *)(depthStencilParams._0_8_ + 8));
  ::vk::checkResult(VVar11,
                    "vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x17b);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R8G8B8A8_UNORM;
  imageParams.extent.width = 0x100;
  imageParams.extent.height = 0x100;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 1;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&pipelineParams,vk,device,&imageParams,
                    (VkAllocationCallbacks *)0x0);
  obj_02 = pipelineParams._0_8_;
  DStack_bd0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_bd0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  DStack_bd0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkImage)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x0);
  uVar7 = depthStencilParams._0_8_;
  VVar11 = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,obj_02,*(undefined8 *)(depthStencilParams._0_8_ + 8),
                      *(undefined8 *)(depthStencilParams._0_8_ + 0x10));
  ::vk::checkResult(VVar11,
                    "vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x193);
  renderPassParams.pAttachments = &colorAttDesc;
  colorAttDesc.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttDesc.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttDesc.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttDesc.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttDesc.flags = 0;
  colorAttDesc.format = VK_FORMAT_R8G8B8A8_UNORM;
  colorAttDesc.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttDesc.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttDesc.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_3a8.pColorAttachments = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  renderPassParams.pSubpasses = &local_3a8;
  local_3a8.pInputAttachments = (VkAttachmentReference *)0x0;
  local_3a8.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_3a8.pPreserveAttachments = (deUint32 *)0x0;
  local_3a8.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_3a8.preserveAttachmentCount = 0;
  local_3a8._60_4_ = 0;
  local_3a8.flags = 0;
  local_3a8.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_3a8.inputAttachmentCount = 0;
  local_3a8._12_4_ = 0;
  local_3a8.colorAttachmentCount = 1;
  local_3a8._28_4_ = 0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 1;
  renderPassParams.subpassCount = 1;
  renderPassParams.dependencyCount = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineParams,vk,device,&renderPassParams,
             (VkAllocationCallbacks *)0x0);
  obj_03 = pipelineParams._0_8_;
  DStack_af0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_af0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  DStack_af0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  colorAttViewParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  colorAttViewParams.pNext = (void *)0x0;
  colorAttViewParams.flags = 0;
  colorAttViewParams.image.m_internal = obj_02;
  colorAttViewParams.viewType = VK_IMAGE_VIEW_TYPE_2D;
  colorAttViewParams.format = VK_FORMAT_R8G8B8A8_UNORM;
  colorAttViewParams.components.r = VK_COMPONENT_SWIZZLE_R;
  colorAttViewParams.components.g = VK_COMPONENT_SWIZZLE_G;
  colorAttViewParams.components.b = VK_COMPONENT_SWIZZLE_B;
  colorAttViewParams.components.a = VK_COMPONENT_SWIZZLE_A;
  colorAttViewParams.subresourceRange.aspectMask = 1;
  colorAttViewParams.subresourceRange.baseMipLevel = 0;
  colorAttViewParams.subresourceRange.levelCount = 1;
  colorAttViewParams.subresourceRange.baseArrayLayer = 0;
  colorAttViewParams.subresourceRange.layerCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineParams,vk,device,&colorAttViewParams,
             (VkAllocationCallbacks *)0x0);
  DStack_990.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_990.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_998.m_internal = pipelineParams._0_8_;
  DStack_990.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineParams,vk,device,
             &pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  DStack_9b0.m_device._0_4_ = pipelineParams.flags;
  DStack_9b0.m_device._4_4_ = pipelineParams.stageCount;
  DStack_9b0.m_allocator._0_4_ = pipelineParams.pStages._0_4_;
  DStack_9b0.m_allocator._4_4_ = pipelineParams.pStages._4_4_;
  local_9b8 = pipelineParams.sType;
  uStack_9b4 = pipelineParams._4_4_;
  DStack_9b0.m_deviceIface._0_4_ = pipelineParams.pNext._0_4_;
  DStack_9b0.m_deviceIface._4_4_ = pipelineParams.pNext._4_4_;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  pVVar1 = &depthStencilParams.flags;
  depthStencilParams._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthStencilParams,"vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_9d0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_9d0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_9d8.m_internal = pipelineParams._0_8_;
  DStack_9d0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  if ((VkPipelineDepthStencilStateCreateFlags *)depthStencilParams._0_8_ != pVVar1) {
    operator_delete((void *)depthStencilParams._0_8_,depthStencilParams._16_8_ + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  depthStencilParams._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthStencilParams,"frag","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_9f0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_9f0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_9f8.m_internal = pipelineParams._0_8_;
  DStack_9f0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  if ((VkPipelineDepthStencilStateCreateFlags *)depthStencilParams._0_8_ != pVVar1) {
    operator_delete((void *)depthStencilParams._0_8_,depthStencilParams._16_8_ + 1);
  }
  shaderStageParams[0].pSpecializationInfo = &emptyShaderSpecParams;
  emptyShaderSpecParams.dataSize = 0;
  emptyShaderSpecParams.pData = (void *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  pipelineParams.pStages = shaderStageParams;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[0].pNext = (void *)0x0;
  shaderStageParams[0].flags = 0;
  shaderStageParams[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStageParams[0].module.m_internal = local_9d8.m_internal;
  shaderStageParams[0].pName = "main";
  shaderStageParams[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[1].pNext = (void *)0x0;
  shaderStageParams[1].flags = 0;
  shaderStageParams[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStageParams[1].module.m_internal = local_9f8.m_internal;
  shaderStageParams[1].pName = "main";
  depthStencilParams.pNext = (void *)0x0;
  depthStencilParams.flags = 0;
  depthStencilParams.depthTestEnable = 0;
  depthStencilParams.front.compareMask = 0;
  depthStencilParams.front.writeMask = 0;
  depthStencilParams.back.writeMask = 0;
  depthStencilParams.back.reference = 0;
  depthStencilParams.front.reference = 0;
  depthStencilParams.back.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.depthBoundsTestEnable = 0;
  depthStencilParams.stencilTestEnable = 0;
  depthStencilParams.front.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  depthStencilParams._4_4_ = 0;
  depthStencilParams.depthWriteEnable = 0;
  depthStencilParams.depthCompareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.front.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareMask = 0;
  depthStencilParams.minDepthBounds = 0.0;
  depthStencilParams.maxDepthBounds = 1.0;
  viewportParams.pViewports = &viewport0;
  viewport0.x = 0.0;
  viewport0.y = 0.0;
  viewport0.width = 256.0;
  viewport0.height = 256.0;
  viewport0.minDepth = 0.0;
  viewport0.maxDepth = 1.0;
  viewportParams.pScissors = &scissor0;
  scissor0.offset.x = 0;
  scissor0.offset.y = 0;
  scissor0.extent.width = 0x100;
  scissor0.extent.height = 0x100;
  pipelineParams.pViewportState = &viewportParams;
  viewportParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportParams.pNext = (void *)0x0;
  viewportParams.flags = 0;
  viewportParams.viewportCount = 1;
  viewportParams.scissorCount = 1;
  multisampleParams.pSampleMask = &sampleMask;
  sampleMask = 0xffffffff;
  pipelineParams.pMultisampleState = &multisampleParams;
  multisampleParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleParams.pNext = (void *)0x0;
  multisampleParams.flags = 0;
  multisampleParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  multisampleParams.sampleShadingEnable = 0;
  multisampleParams.minSampleShading = 0.0;
  multisampleParams.alphaToCoverageEnable = 0;
  multisampleParams.alphaToOneEnable = 0;
  pipelineParams.pRasterizationState = &rasterParams;
  rasterParams.pNext = (void *)0x0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.depthBiasClamp = 0.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterParams._4_4_ = 0;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 1;
  rasterParams.lineWidth = 1.0;
  rasterParams._60_4_ = 0;
  pipelineParams.pInputAssemblyState = &inputAssemblyParams;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyParams.primitiveRestartEnable = 0;
  inputAssemblyParams._28_4_ = 0;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyParams._4_4_ = 0;
  inputAssemblyParams.pNext = (void *)0x0;
  vertexInputStateParams.pVertexBindingDescriptions = &vertexBinding0;
  vertexBinding0.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexBinding0.binding = 0;
  vertexBinding0.stride = 0x10;
  vertexInputStateParams.pVertexAttributeDescriptions = &vertexAttrib0;
  vertexAttrib0.location = 0;
  vertexAttrib0.binding = 0;
  vertexAttrib0.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttrib0.offset = 0;
  pipelineParams.pVertexInputState = &vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  vertexInputStateParams.vertexAttributeDescriptionCount = 1;
  local_510.pAttachments = &attBlendParams;
  attBlendParams.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.alphaBlendOp = VK_BLEND_OP_ADD;
  attBlendParams.colorWriteMask = 0xf;
  attBlendParams.blendEnable = 0;
  attBlendParams.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.colorBlendOp = VK_BLEND_OP_ADD;
  pipelineParams.pColorBlendState = &local_510;
  local_510.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_510.pNext = (void *)0x0;
  local_510.flags = 0;
  local_510.logicOpEnable = 0;
  local_510.logicOp = VK_LOGIC_OP_COPY;
  local_510.attachmentCount = 1;
  local_510.blendConstants[0] = 0.0;
  local_510.blendConstants[1] = 0.0;
  local_510.blendConstants[2] = 0.0;
  local_510.blendConstants[3] = 0.0;
  pipelineParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 2;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  pipelineParams.layout.m_internal = CONCAT44(uStack_9b4,local_9b8);
  pipelineParams.renderPass.m_internal = obj_03;
  pipelineParams.subpass = 0;
  pipelineParams.basePipelineHandle.m_internal = 0;
  pipelineParams.basePipelineIndex = 0;
  pipelineParams.pDepthStencilState = &depthStencilParams;
  shaderStageParams[1].pSpecializationInfo = shaderStageParams[0].pSpecializationInfo;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&colorAttBarrier,vk,device,
             (VkPipelineCache)0x0,&pipelineParams,(VkAllocationCallbacks *)0x0);
  DStack_a10.m_device = (VkDevice)colorAttBarrier._16_8_;
  DStack_a10.m_allocator = (VkAllocationCallbacks *)colorAttBarrier._24_8_;
  local_a18.m_internal = colorAttBarrier._0_8_;
  DStack_a10.m_deviceIface = (DeviceInterface *)colorAttBarrier.pNext;
  framebufferParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.pNext = (void *)0x0;
  framebufferParams.flags = 0;
  framebufferParams.renderPass.m_internal = obj_03;
  framebufferParams.attachmentCount = 1;
  framebufferParams.pAttachments = &local_998;
  framebufferParams.width = 0x100;
  framebufferParams.height = 0x100;
  framebufferParams.layers = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttBarrier,vk,device,&framebufferParams,
             (VkAllocationCallbacks *)0x0);
  DStack_a30.m_device = (VkDevice)colorAttBarrier._16_8_;
  DStack_a30.m_allocator = (VkAllocationCallbacks *)colorAttBarrier._24_8_;
  local_a38.m_internal = colorAttBarrier._0_8_;
  DStack_a30.m_deviceIface = (DeviceInterface *)colorAttBarrier.pNext;
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  cmdPoolParams.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttBarrier,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  obj_00 = colorAttBarrier._0_8_;
  DStack_a50.m_device = (VkDevice)colorAttBarrier._16_8_;
  DStack_a50.m_allocator = (VkAllocationCallbacks *)colorAttBarrier._24_8_;
  DStack_a50.m_deviceIface = (DeviceInterface *)colorAttBarrier.pNext;
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = colorAttBarrier._0_8_;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttBarrier,vk,device,&cmdBufParams);
  local_c28 = colorAttBarrier.srcAccessMask;
  VStack_c24 = colorAttBarrier.dstAccessMask;
  VStack_c20 = colorAttBarrier.oldLayout;
  VStack_c1c = colorAttBarrier.newLayout;
  local_c38 = colorAttBarrier._0_8_;
  plStack_c30 = (long *)colorAttBarrier.pNext;
  VVar11 = (*vk->_vptr_DeviceInterface[0x49])(vk,colorAttBarrier._0_8_);
  ::vk::checkResult(VVar11,"vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x2de);
  vertFlushBarrier.srcAccessMask = 0x4000;
  vertFlushBarrier.dstAccessMask = 4;
  vertFlushBarrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  vertFlushBarrier._4_4_ = 0;
  vertFlushBarrier.pNext = (void *)0x0;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier.srcAccessMask = 0;
  colorAttBarrier.dstAccessMask = 0x180;
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttBarrier.dstQueueFamilyIndex = queueFamilyIndex;
  colorAttBarrier.srcQueueFamilyIndex = queueFamilyIndex;
  colorAttBarrier.image.m_internal = obj_02;
  colorAttBarrier.subresourceRange.aspectMask = 1;
  colorAttBarrier.subresourceRange.baseMipLevel = 0;
  colorAttBarrier.subresourceRange.levelCount = 1;
  colorAttBarrier.subresourceRange.baseArrayLayer = 0;
  colorAttBarrier.subresourceRange.layerCount = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_c38,0x4000,0x10000,0,1,&vertFlushBarrier,0,0,1,&colorAttBarrier);
  uVar9 = pipelineParams._0_8_;
  vertFlushBarrier.sType = (VkStructureType)clearColor.m_data[0];
  vertFlushBarrier._4_4_ = clearColor.m_data[1];
  vertFlushBarrier.pNext = (void *)clearColor.m_data._8_8_;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  colorAttBarrier.pNext = (void *)0x0;
  pipelineParams.sType = (VkStructureType)obj_03;
  pipelineParams._4_4_ = SUB84(obj_03,4);
  colorAttBarrier.srcAccessMask = pipelineParams.sType;
  colorAttBarrier.dstAccessMask = pipelineParams._4_4_;
  colorAttBarrier.oldLayout = (undefined4)local_a38.m_internal;
  colorAttBarrier.newLayout = local_a38.m_internal._4_4_;
  colorAttBarrier.srcQueueFamilyIndex = 0;
  colorAttBarrier.dstQueueFamilyIndex = 0;
  colorAttBarrier.image.m_internal = 0x10000000100;
  colorAttBarrier.subresourceRange.aspectMask = 1;
  colorAttBarrier.subresourceRange._8_8_ = &vertFlushBarrier;
  pipelineParams._0_8_ = uVar9;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_c38,&colorAttBarrier,0);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_c38,0,local_a18.m_internal);
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttBarrier._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_c38,0,1,&local_ad8,&colorAttBarrier);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_c38,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_c38);
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier.srcAccessMask = 0x100;
  colorAttBarrier.dstAccessMask = 0x800;
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  colorAttBarrier.dstQueueFamilyIndex = queueFamilyIndex;
  colorAttBarrier.srcQueueFamilyIndex = queueFamilyIndex;
  colorAttBarrier.image.m_internal = obj_02;
  colorAttBarrier.subresourceRange.aspectMask = 1;
  colorAttBarrier.subresourceRange.baseMipLevel = 0;
  colorAttBarrier.subresourceRange.levelCount = 1;
  colorAttBarrier.subresourceRange.baseArrayLayer = 0;
  colorAttBarrier.subresourceRange.layerCount = 1;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_c38,0x8000,0x1000,0,0,0,0,0,1,&colorAttBarrier);
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttBarrier._4_4_ = 0;
  colorAttBarrier.pNext = (void *)0x10000000100;
  colorAttBarrier.srcAccessMask = 1;
  colorAttBarrier.dstAccessMask = 0;
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_GENERAL;
  colorAttBarrier.srcQueueFamilyIndex = 0;
  colorAttBarrier.dstQueueFamilyIndex = 0;
  colorAttBarrier.image.m_internal = 0x10000000000;
  colorAttBarrier.subresourceRange.aspectMask = 0x100;
  colorAttBarrier.subresourceRange.baseMipLevel = 1;
  (*vk->_vptr_DeviceInterface[99])(vk,local_c38,obj_02,6,obj_01,1,&colorAttBarrier);
  uVar9 = pipelineParams._0_8_;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier.srcAccessMask = 0x1000;
  colorAttBarrier.dstAccessMask = 0x2000;
  colorAttBarrier.newLayout = queueFamilyIndex;
  colorAttBarrier.oldLayout = queueFamilyIndex;
  pipelineParams.sType = (VkStructureType)obj_01;
  pipelineParams._4_4_ = SUB84(obj_01,4);
  colorAttBarrier.srcQueueFamilyIndex = pipelineParams.sType;
  colorAttBarrier.dstQueueFamilyIndex = pipelineParams._4_4_;
  colorAttBarrier.image.m_internal = 0;
  colorAttBarrier.subresourceRange.aspectMask = 0x40000;
  colorAttBarrier.subresourceRange.baseMipLevel = 0;
  pipelineParams._0_8_ = uVar9;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_c38,0x1000,0x4000,0,0,0,1,&colorAttBarrier,0,0);
  VVar11 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_c38);
  ::vk::checkResult(VVar11,"vk.endCommandBuffer(*cmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x359);
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier._16_8_ = *(undefined8 *)(uVar5 + 8);
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.srcQueueFamilyIndex = 0x30;
  colorAttBarrier.dstQueueFamilyIndex = 0;
  pfVar4 = *(float **)(uVar5 + 0x18);
  pfVar4[8] = vertices[2].m_data[0];
  pfVar4[9] = vertices[2].m_data[1];
  pfVar4[10] = vertices[2].m_data[2];
  pfVar4[0xb] = vertices[2].m_data[3];
  pfVar4[4] = vertices[1].m_data[0];
  pfVar4[5] = vertices[1].m_data[1];
  pfVar4[6] = vertices[1].m_data[2];
  pfVar4[7] = vertices[1].m_data[3];
  *pfVar4 = vertices[0].m_data[0];
  pfVar4[1] = vertices[0].m_data[1];
  pfVar4[2] = vertices[0].m_data[2];
  pfVar4[3] = vertices[0].m_data[3];
  VVar11 = (*vk->_vptr_DeviceInterface[9])(vk,device,1);
  ::vk::checkResult(VVar11,"vk.flushMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x368);
  fenceParams.flags = 0;
  fenceParams._20_4_ = 0;
  fenceParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceParams._4_4_ = 0;
  fenceParams.pNext = (void *)0x0;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier.srcQueueFamilyIndex = 0;
  colorAttBarrier.dstQueueFamilyIndex = 0;
  colorAttBarrier.subresourceRange.levelCount = 0;
  colorAttBarrier.subresourceRange.baseArrayLayer = 0;
  colorAttBarrier.srcAccessMask = 0;
  colorAttBarrier.dstAccessMask = 0;
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.subresourceRange.layerCount = 0;
  colorAttBarrier._68_4_ = 0;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  colorAttBarrier._4_4_ = 0;
  colorAttBarrier.image.m_internal = 1;
  colorAttBarrier.subresourceRange._0_8_ = &local_c38;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&refImage,vk,device,&fenceParams,
                    (VkAllocationCallbacks *)0x0);
  vertFlushBarrier._4_4_ = refImage.m_format.type;
  vertFlushBarrier.sType = refImage.m_format.order;
  VVar11 = (*vk->_vptr_DeviceInterface[2])(vk,local_aa8,1,&colorAttBarrier,vertFlushBarrier._0_8_);
  ::vk::checkResult(VVar11,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x381);
  VVar11 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&vertFlushBarrier,1,0xffffffffffffffff);
  ::vk::checkResult(VVar11,"vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x382);
  if (vertFlushBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&vertFlushBarrier.pNext,
               (VkFence)vertFlushBarrier._0_8_);
  }
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  colorAttBarrier.pNext = (void *)0x0;
  colorAttBarrier._16_8_ = *(undefined8 *)(uVar6 + 8);
  colorAttBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttBarrier.srcQueueFamilyIndex = 0x40000;
  colorAttBarrier.dstQueueFamilyIndex = 0;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&vertFlushBarrier,&tcuFormat,0x100,0x100,1,
             *(void **)(uVar6 + 0x18));
  VVar11 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&colorAttBarrier);
  ::vk::checkResult(VVar11,"vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x392);
  tcu::TextureLevel::TextureLevel(&refImage,&tcuFormat,0x100,0x100,1);
  threshold.m_data[0] = 0;
  threshold.m_data[1] = 0;
  threshold.m_data[2] = 0;
  threshold.m_data[3] = 0;
  posDeviation.m_data[0] = 1;
  posDeviation.m_data[1] = 1;
  posDeviation.m_data[2] = 0;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  tcu::clear((PixelBufferAccess *)&fenceParams,&clearColor);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  renderReferenceTriangle((PixelBufferAccess *)&fenceParams,&vertices);
  log = context->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  bVar10 = tcu::intThresholdPositionDeviationCompare
                     (log,"ComparisonResult","Image comparison result",
                      (ConstPixelBufferAccess *)&fenceParams,
                      (ConstPixelBufferAccess *)&vertFlushBarrier,&threshold,&posDeviation,false,
                      COMPARE_LOG_RESULT);
  pTVar8 = local_ab0;
  pVVar2 = &fenceParams.flags;
  fenceParams._0_8_ = pVVar2;
  if (bVar10) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&fenceParams,"Rendering succeeded","")
    ;
    pTVar8->m_code = QP_TEST_RESULT_PASS;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,fenceParams._0_8_,
               (long)fenceParams.pNext + fenceParams._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fenceParams,"Image comparison failed","");
    pTVar8->m_code = QP_TEST_RESULT_FAIL;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,fenceParams._0_8_,
               (long)fenceParams.pNext + fenceParams._0_8_);
  }
  if ((VkFenceCreateFlags *)fenceParams._0_8_ != pVVar2) {
    operator_delete((void *)fenceParams._0_8_,fenceParams._16_8_ + 1);
  }
  tcu::TextureLevel::~TextureLevel(&refImage);
  if (local_c38 != 0) {
    colorAttBarrier._0_8_ = local_c38;
    (**(code **)(*plStack_c30 + 0x240))
              (plStack_c30,CONCAT44(VStack_c24,local_c28),CONCAT44(VStack_c1c,VStack_c20),1);
  }
  if (obj_00 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_a50,(VkCommandPool)obj_00);
  }
  if (local_a38.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_a30,local_a38);
  }
  if (local_a18.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_a10,local_a18);
  }
  if (local_9f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_9f0,local_9f8);
  }
  if (local_9d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_9d0,local_9d8);
  }
  obj.m_internal._4_4_ = uStack_9b4;
  obj.m_internal._0_4_ = local_9b8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_9b0,obj);
  }
  if (local_998.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_990,local_998);
  }
  if (obj_03 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_af0,(VkRenderPass)obj_03);
  }
  if (uVar7 != 0) {
    (**(code **)(*(long *)uVar7 + 8))();
  }
  if (obj_02 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_bd0,(VkImage)obj_02);
  }
  if (uVar6 != 0) {
    (**(code **)(*(long *)uVar6 + 8))();
  }
  if (obj_01 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_b40,(VkBuffer)obj_01);
  }
  if (uVar5 != 0) {
    (**(code **)(*(long *)uVar5 + 8))(uVar5);
  }
  if (local_ad8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_ad0,local_ad8);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus renderTriangleTest (Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	SimpleAllocator							memAlloc				(vk, vkDevice, getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()));
	const tcu::IVec2						renderSize				(256, 256);
	const VkFormat							colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const tcu::Vec4							clearColor				(0.125f, 0.25f, 0.75f, 1.0f);

	const tcu::Vec4							vertices[]				=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	const VkBufferCreateInfo				vertexBufferParams		=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		(VkDeviceSize)sizeof(vertices),			// size
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		1u,										// queueFamilyIndexCount
		&queueFamilyIndex,						// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					vertexBuffer			(createBuffer(vk, vkDevice, &vertexBufferParams));
	const UniquePtr<Allocation>				vertexBufferMemory		(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

	const VkDeviceSize						imageSizeBytes			= (VkDeviceSize)(sizeof(deUint32)*renderSize.x()*renderSize.y());
	const VkBufferCreateInfo				readImageBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// sType
		DE_NULL,									// pNext
		(VkBufferCreateFlags)0u,					// flags
		imageSizeBytes,								// size
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// usage
		VK_SHARING_MODE_EXCLUSIVE,					// sharingMode
		1u,											// queueFamilyIndexCount
		&queueFamilyIndex,							// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					readImageBuffer			(createBuffer(vk, vkDevice, &readImageBufferParams));
	const UniquePtr<Allocation>				readImageBufferMemory	(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *readImageBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset()));

	const VkImageCreateInfo					imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,									// sType
		DE_NULL,																// pNext
		0u,																		// flags
		VK_IMAGE_TYPE_2D,														// imageType
		VK_FORMAT_R8G8B8A8_UNORM,												// format
		{ (deUint32)renderSize.x(), (deUint32)renderSize.y(), 1 },				// extent
		1u,																		// mipLevels
		1u,																		// arraySize
		VK_SAMPLE_COUNT_1_BIT,													// samples
		VK_IMAGE_TILING_OPTIMAL,												// tiling
		VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|VK_IMAGE_USAGE_TRANSFER_SRC_BIT,	// usage
		VK_SHARING_MODE_EXCLUSIVE,												// sharingMode
		1u,																		// queueFamilyIndexCount
		&queueFamilyIndex,														// pQueueFamilyIndices
		VK_IMAGE_LAYOUT_UNDEFINED,												// initialLayout
	};

	const Unique<VkImage>					image					(createImage(vk, vkDevice, &imageParams));
	const UniquePtr<Allocation>				imageMemory				(memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any));

	VK_CHECK(vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset()));

	const VkAttachmentDescription			colorAttDesc			=
	{
		0u,												// flags
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		VK_SAMPLE_COUNT_1_BIT,							// samples
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// loadOp
		VK_ATTACHMENT_STORE_OP_STORE,					// storeOp
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// stencilLoadOp
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// stencilStoreOp
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// initialLayout
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// finalLayout
	};
	const VkAttachmentReference				colorAttRef				=
	{
		0u,												// attachment
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// layout
	};
	const VkSubpassDescription				subpassDesc				=
	{
		(VkSubpassDescriptionFlags)0u,					// flags
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// pipelineBindPoint
		0u,												// inputAttachmentCount
		DE_NULL,										// pInputAttachments
		1u,												// colorAttachmentCount
		&colorAttRef,									// pColorAttachments
		DE_NULL,										// pResolveAttachments
		DE_NULL,										// depthStencilAttachment
		0u,												// preserveAttachmentCount
		DE_NULL,										// pPreserveAttachments
	};
	const VkRenderPassCreateInfo			renderPassParams		=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		1u,												// attachmentCount
		&colorAttDesc,									// pAttachments
		1u,												// subpassCount
		&subpassDesc,									// pSubpasses
		0u,												// dependencyCount
		DE_NULL,										// pDependencies
	};
	const Unique<VkRenderPass>				renderPass				(createRenderPass(vk, vkDevice, &renderPassParams));

	const VkImageViewCreateInfo				colorAttViewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		*image,											// image
		VK_IMAGE_VIEW_TYPE_2D,							// viewType
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		{
			VK_COMPONENT_SWIZZLE_R,
			VK_COMPONENT_SWIZZLE_G,
			VK_COMPONENT_SWIZZLE_B,
			VK_COMPONENT_SWIZZLE_A
		},												// components
		{
			VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
			0u,												// baseMipLevel
			1u,												// levelCount
			0u,												// baseArrayLayer
			1u,												// layerCount
		},												// subresourceRange
	};
	const Unique<VkImageView>				colorAttView			(createImageView(vk, vkDevice, &colorAttViewParams));

	// Pipeline layout
	const VkPipelineLayoutCreateInfo		pipelineLayoutParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,			// sType
		DE_NULL,												// pNext
		(vk::VkPipelineLayoutCreateFlags)0,
		0u,														// setLayoutCount
		DE_NULL,												// pSetLayouts
		0u,														// pushConstantRangeCount
		DE_NULL,												// pPushConstantRanges
	};
	const Unique<VkPipelineLayout>			pipelineLayout			(createPipelineLayout(vk, vkDevice, &pipelineLayoutParams));

	// Shaders
	const Unique<VkShaderModule>			vertShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("vert"), 0));
	const Unique<VkShaderModule>			fragShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("frag"), 0));

	// Pipeline
	const VkSpecializationInfo				emptyShaderSpecParams	=
	{
		0u,														// mapEntryCount
		DE_NULL,												// pMap
		0,														// dataSize
		DE_NULL,												// pData
	};
	const VkPipelineShaderStageCreateInfo	shaderStageParams[]	=
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_VERTEX_BIT,								// stage
			*vertShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_FRAGMENT_BIT,							// stage
			*fragShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		}
	};
	const VkPipelineDepthStencilStateCreateInfo	depthStencilParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// depthTestEnable
		DE_FALSE,													// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,										// depthCompareOp
		DE_FALSE,													// depthBoundsTestEnable
		DE_FALSE,													// stencilTestEnable
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// front
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// back;
		0.0f,														//	float				minDepthBounds;
		1.0f,														//	float				maxDepthBounds;
	};
	const VkViewport						viewport0				=
	{
		0.0f,														// x
		0.0f,														// y
		(float)renderSize.x(),										// width
		(float)renderSize.y(),										// height
		0.0f,														// minDepth
		1.0f,														// maxDepth
	};
	const VkRect2D							scissor0				=
	{
		{
			0u,															// x
			0u,															// y
		},															// offset
		{
			(deUint32)renderSize.x(),									// width
			(deUint32)renderSize.y(),									// height
		},															// extent;
	};
	const VkPipelineViewportStateCreateInfo		viewportParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,		// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// viewportCount
		&viewport0,													// pViewports
		1u,															// scissorCount
		&scissor0													// pScissors
	};
	const VkSampleMask							sampleMask				= ~0u;
	const VkPipelineMultisampleStateCreateInfo	multisampleParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_SAMPLE_COUNT_1_BIT,										// rasterizationSamples
		VK_FALSE,													// sampleShadingEnable
		0.0f,														// minSampleShading
		&sampleMask,												// sampleMask
		VK_FALSE,													// alphaToCoverageEnable
		VK_FALSE,													// alphaToOneEnable
	};
	const VkPipelineRasterizationStateCreateInfo	rasterParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_TRUE,													// depthClampEnable
		VK_FALSE,													// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,										// polygonMode
		VK_CULL_MODE_NONE,											// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// frontFace
		VK_FALSE,													// depthBiasEnable
		0.0f,														// depthBiasConstantFactor
		0.0f,														// depthBiasClamp
		0.0f,														// depthBiasSlopeFactor
		1.0f,														// lineWidth
	};
	const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,														// pNext
		0u,																// flags
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		DE_FALSE,														// primitiveRestartEnable
	};
	const VkVertexInputBindingDescription		vertexBinding0			=
	{
		0u,														// binding
		(deUint32)sizeof(tcu::Vec4),							// stride
		VK_VERTEX_INPUT_RATE_VERTEX,							// inputRate
	};
	const VkVertexInputAttributeDescription		vertexAttrib0			=
	{
		0u,														// location
		0u,														// binding
		VK_FORMAT_R32G32B32A32_SFLOAT,							// format
		0u,														// offset
	};
	const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// vertexBindingDescriptionCount
		&vertexBinding0,											// pVertexBindingDescriptions
		1u,															// vertexAttributeDescriptionCount
		&vertexAttrib0,												// pVertexAttributeDescriptions
	};
	const VkPipelineColorBlendAttachmentState	attBlendParams			=
	{
		VK_FALSE,													// blendEnable
		VK_BLEND_FACTOR_ONE,										// srcColorBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstColorBlendFactor
		VK_BLEND_OP_ADD,											// colorBlendOp
		VK_BLEND_FACTOR_ONE,										// srcAlphaBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstAlphaBlendFactor
		VK_BLEND_OP_ADD,											// alphaBlendOp
		(VK_COLOR_COMPONENT_R_BIT|
		 VK_COLOR_COMPONENT_G_BIT|
		 VK_COLOR_COMPONENT_B_BIT|
		 VK_COLOR_COMPONENT_A_BIT),									// colorWriteMask
	};
	const VkPipelineColorBlendStateCreateInfo	blendParams				=
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// logicOpEnable
		VK_LOGIC_OP_COPY,											// logicOp
		1u,															// attachmentCount
		&attBlendParams,											// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// blendConstants[4]
	};
	const VkGraphicsPipelineCreateInfo		pipelineParams			=
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,		// sType
		DE_NULL,												// pNext
		0u,														// flags
		(deUint32)DE_LENGTH_OF_ARRAY(shaderStageParams),		// stageCount
		shaderStageParams,										// pStages
		&vertexInputStateParams,								// pVertexInputState
		&inputAssemblyParams,									// pInputAssemblyState
		DE_NULL,												// pTessellationState
		&viewportParams,										// pViewportState
		&rasterParams,											// pRasterizationState
		&multisampleParams,										// pMultisampleState
		&depthStencilParams,									// pDepthStencilState
		&blendParams,											// pColorBlendState
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,		// pDynamicState
		*pipelineLayout,										// layout
		*renderPass,											// renderPass
		0u,														// subpass
		DE_NULL,												// basePipelineHandle
		0u,														// basePipelineIndex
	};

	const Unique<VkPipeline>				pipeline				(createGraphicsPipeline(vk, vkDevice, DE_NULL, &pipelineParams));

	// Framebuffer
	const VkFramebufferCreateInfo			framebufferParams		=
	{
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,				// sType
		DE_NULL,												// pNext
		0u,														// flags
		*renderPass,											// renderPass
		1u,														// attachmentCount
		&*colorAttView,											// pAttachments
		(deUint32)renderSize.x(),								// width
		(deUint32)renderSize.y(),								// height
		1u,														// layers
	};
	const Unique<VkFramebuffer>				framebuffer				(createFramebuffer(vk, vkDevice, &framebufferParams));

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags
		queueFamilyIndex,											// queueFamilyIndex
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,			// sType
		DE_NULL,												// pNext
		*cmdPool,												// pool
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,						// level
		1u,														// bufferCount
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			cmdBufBeginParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// sType
		DE_NULL,												// pNext
		0u,														// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Record commands
	VK_CHECK(vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams));

	{
		const VkMemoryBarrier		vertFlushBarrier	=
		{
			VK_STRUCTURE_TYPE_MEMORY_BARRIER,			// sType
			DE_NULL,									// pNext
			VK_ACCESS_HOST_WRITE_BIT,					// srcAccessMask
			VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT,		// dstAccessMask
		};
		const VkImageMemoryBarrier	colorAttBarrier		=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			0u,											// srcAccessMask
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),		// dstAccessMask
			VK_IMAGE_LAYOUT_UNDEFINED,					// oldLayout
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// levelCount
				0u,											// baseArrayLayer
				1u,											// layerCount
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, (VkDependencyFlags)0, 1, &vertFlushBarrier, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &colorAttBarrier);
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(clearColor[0],
																			 clearColor[1],
																			 clearColor[2],
																			 clearColor[3]);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,			// sType
			DE_NULL,											// pNext
			*renderPass,										// renderPass
			*framebuffer,										// framebuffer
			{
				{ 0, 0 },
				{ (deUint32)renderSize.x(), (deUint32)renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		vk.cmdBeginRenderPass(*cmdBuf, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	vk.cmdBindPipeline(*cmdBuf, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkDeviceSize bindingOffset = 0;
		vk.cmdBindVertexBuffers(*cmdBuf, 0u, 1u, &vertexBuffer.get(), &bindingOffset);
	}
	vk.cmdDraw(*cmdBuf, 3u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuf);

	{
		const VkImageMemoryBarrier	renderFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// outputMask
			VK_ACCESS_TRANSFER_READ_BIT,				// inputMask
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// oldLayout
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// mipLevels
				0u,											// baseArraySlice
				1u,											// arraySize
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &renderFinishBarrier);
	}

	{
		const VkBufferImageCopy	copyParams	=
		{
			(VkDeviceSize)0u,						// bufferOffset
			(deUint32)renderSize.x(),				// bufferRowLength
			(deUint32)renderSize.y(),				// bufferImageHeight
			{
				VK_IMAGE_ASPECT_COLOR_BIT,				// aspectMask
				0u,										// mipLevel
				0u,										// baseArrayLayer
				1u,										// layerCount
			},										// imageSubresource
			{ 0u, 0u, 0u },							// imageOffset
			{
				(deUint32)renderSize.x(),
				(deUint32)renderSize.y(),
				1u
			}										// imageExtent
		};
		vk.cmdCopyImageToBuffer(*cmdBuf, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	{
		const VkBufferMemoryBarrier	copyFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// sType
			DE_NULL,									// pNext
			VK_ACCESS_TRANSFER_WRITE_BIT,				// srcAccessMask
			VK_ACCESS_HOST_READ_BIT,					// dstAccessMask
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*readImageBuffer,							// buffer
			0u,											// offset
			imageSizeBytes								// size
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuf));

	// Upload vertex data
	{
		const VkMappedMemoryRange	range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			vertexBufferMemory->getMemory(),		// memory
			0,										// offset
			(VkDeviceSize)sizeof(vertices),			// size
		};
		void*						vertexBufPtr	= vertexBufferMemory->getHostPtr();

		deMemcpy(vertexBufPtr, &vertices[0], sizeof(vertices));
		VK_CHECK(vk.flushMappedMemoryRanges(vkDevice, 1u, &range));
	}

	// Submit & wait for completion
	{
		const VkFenceCreateInfo	fenceParams	=
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// sType
			DE_NULL,								// pNext
			0u,										// flags
		};
		const VkSubmitInfo		submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,
			1u,										// commandBufferCount
			&cmdBuf.get(),							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL,								// pSignalSemaphores
		};
		const Unique<VkFence>	fence		(createFence(vk, vkDevice, &fenceParams));

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read results, render reference, compare
	{
		const tcu::TextureFormat			tcuFormat		= vk::mapVkFormat(colorFormat);
		const VkMappedMemoryRange			range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			readImageBufferMemory->getMemory(),		// memory
			0,										// offset
			imageSizeBytes,							// size
		};
		const tcu::ConstPixelBufferAccess	resultAccess	(tcuFormat, renderSize.x(), renderSize.y(), 1, readImageBufferMemory->getHostPtr());

		VK_CHECK(vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range));

		{
			tcu::TextureLevel	refImage		(tcuFormat, renderSize.x(), renderSize.y());
			const tcu::UVec4	threshold		(0u);
			const tcu::IVec3	posDeviation	(1,1,0);

			tcu::clear(refImage.getAccess(), clearColor);
			renderReferenceTriangle(refImage.getAccess(), vertices);

			if (tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(),
														  "ComparisonResult",
														  "Image comparison result",
														  refImage.getAccess(),
														  resultAccess,
														  threshold,
														  posDeviation,
														  false,
														  tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::pass("Rendering succeeded");
			else
				return tcu::TestStatus::fail("Image comparison failed");
		}
	}

	return tcu::TestStatus::pass("Rendering succeeded");
}